

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::DeepTiledInputFile::Data::TileBufferTask::TileBufferTask
          (TileBufferTask *this,TaskGroup *group,Data *ifd,TileProcessGroup *tileg,
          DeepFrameBuffer *outfb,exr_chunk_info_t *cinfo,bool countsOnly)

{
  Task *pTVar1;
  Process *pPVar2;
  TaskGroup *in_RCX;
  TaskGroup *in_RDX;
  Task *in_RDI;
  _func_int **in_R8;
  void *in_R9;
  byte in_stack_00000008;
  TaskGroup *in_stack_ffffffffffffff98;
  ProcessGroup<Imf_3_3::(anonymous_namespace)::TileProcess,_true> *in_stack_ffffffffffffffb0;
  
  IlmThread_3_3::Task::Task(in_RDI,in_stack_ffffffffffffff98);
  in_RDI->_vptr_Task = (_func_int **)&PTR__TileBufferTask_036c6f90;
  in_RDI[1]._vptr_Task = in_R8;
  in_RDI[1]._group = in_RDX;
  pTVar1 = in_RDI + 2;
  pPVar2 = IlmThread_3_3::ProcessGroup<Imf_3_3::(anonymous_namespace)::TileProcess,_true>::pop
                     (in_stack_ffffffffffffffb0);
  pTVar1->_vptr_Task = (_func_int **)pPVar2;
  in_RDI[2]._group = in_RCX;
  memcpy(in_RDI[2]._vptr_Task + 1,in_R9,0x40);
  *(byte *)((long)in_RDI[2]._vptr_Task + 5) = in_stack_00000008 & 1;
  return;
}

Assistant:

TileBufferTask (
            ILMTHREAD_NAMESPACE::TaskGroup* group,
            Data*                   ifd,
            TileProcessGroup*       tileg,
            const DeepFrameBuffer*  outfb,
            const exr_chunk_info_t& cinfo,
            bool                    countsOnly)
            : Task (group)
            , _outfb (outfb)
            , _ifd (ifd)
            , _tile (tileg->pop ())
            , _tile_group (tileg)
        {
            _tile->cinfo = cinfo;
            _tile->counts_only = countsOnly;
        }